

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stackless.hpp
# Opt level: O1

void __thiscall
stackless::microthreading::MicrothreadManager<implementations::brainfck::BFImplementation>::idle
          (MicrothreadManager<implementations::brainfck::BFImplementation> *this)

{
  _Rb_tree_header *p_Var1;
  char cVar2;
  long *plVar3;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
  *p_Var4;
  vector<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::allocator<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>_>
  cleanup_processes;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
  local_40;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
  *local_38;
  iterator iStack_30;
  _Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
  *local_28;
  
  local_38 = (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
              *)0x0;
  iStack_30._M_current =
       (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
        *)0x0;
  local_28 = (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
              *)0x0;
  local_40._M_node = (this->threads)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->threads)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)local_40._M_node != p_Var1) {
    do {
      if (*(char *)((long)&local_40._M_node[1]._M_left + 4) == '\0') {
        plVar3 = (long *)(*(code *)**(undefined8 **)local_40._M_node[1]._M_right)();
        cVar2 = (**(code **)(*plVar3 + 0x10))(plVar3);
        if (cVar2 != '\0') {
          thread_remove_scheduling(this,(_threads_iterator)local_40._M_node);
          if (iStack_30._M_current == local_28) {
            std::
            vector<std::_Rb_tree_iterator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>,std::allocator<std::_Rb_tree_iterator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>>
            ::
            _M_realloc_insert<std::_Rb_tree_iterator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>const&>
                      ((vector<std::_Rb_tree_iterator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>,std::allocator<std::_Rb_tree_iterator<std::pair<unsigned_int_const,stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>>>>>
                        *)&local_38,iStack_30,&local_40);
          }
          else {
            (iStack_30._M_current)->_M_node = local_40._M_node;
            iStack_30._M_current = iStack_30._M_current + 1;
          }
        }
      }
      local_40._M_node = (_Base_ptr)std::_Rb_tree_increment(local_40._M_node);
    } while ((_Rb_tree_header *)local_40._M_node != p_Var1);
  }
  if (local_38 != iStack_30._M_current) {
    p_Var4 = local_38;
    do {
      std::
      _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>,_std::_Select1st<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>_>
      ::_M_erase_aux(&(this->threads)._M_t,p_Var4->_M_node);
      p_Var4 = p_Var4 + 1;
    } while (p_Var4 != iStack_30._M_current);
  }
  if (local_38 !=
      (_Rb_tree_iterator<std::pair<const_unsigned_int,_stackless::microthreading::Microthread<implementations::brainfck::BFImplementation>_>_>
       *)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

virtual void idle() {
				std::vector<typename _threads_type::iterator> cleanup_processes;
				// Find processes to clean up
				for (auto it = threads.begin(); it != threads.end(); ++it) {
					if (it->second.watched == false && it->second.isResolved()) {
						thread_remove_scheduling(it);
						cleanup_processes.push_back(it);
					}
				}
				// Clean up the processes we found
				for (auto it = cleanup_processes.begin(); it != cleanup_processes.end(); ++it) {
					threads.erase(*it);
				}
			}